

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-power.c
# Opt level: O0

wchar_t extra_might_power(object *obj,wchar_t p,wchar_t mult)

{
  uint uVar1;
  wchar_t mult_local;
  wchar_t p_local;
  object *obj_local;
  
  if (obj->modifiers[0xc] < 4) {
    uVar1 = obj->modifiers[0xc] + mult;
    log_obj("Mult after extra might is %d\n",(ulong)uVar1);
    obj_local._4_4_ = uVar1 * p;
    log_obj("After multiplying power for might, total is %d\n",(ulong)(uint)obj_local._4_4_);
  }
  else {
    obj_local._4_4_ = p + L'丠';
    log_obj("INHIBITING - too much extra might - quitting\n");
  }
  return obj_local._4_4_;
}

Assistant:

static int extra_might_power(const struct object *obj, int p, int mult)
{
	if (obj->modifiers[OBJ_MOD_MIGHT] >= INHIBIT_MIGHT) {
		p += INHIBIT_POWER;
		log_obj("INHIBITING - too much extra might - quitting\n");
		return p;
	} else {
		mult += obj->modifiers[OBJ_MOD_MIGHT];
	}
	log_obj("Mult after extra might is %d\n", mult);
	p *= mult;
	log_obj("After multiplying power for might, total is %d\n", p);
	return p;
}